

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O0

void __thiscall asl::XdlEncoder::new_number(XdlEncoder *this,float x)

{
  bool bVar1;
  int i;
  int iVar2;
  char *pcVar3;
  char *local_20;
  char *p;
  int n;
  float x_local;
  XdlEncoder *this_local;
  
  i = asl::String::length(&this->_out);
  bVar1 = std::isfinite(x);
  if (bVar1) {
    asl::String::resize(&this->_out,i + 0x10,true,true);
    pcVar3 = asl::String::operator[](&this->_out,i);
    iVar2 = snprintf(pcVar3,0x11,this->_fmtF,(double)x);
    asl::String::fix(&this->_out,i + iVar2);
    for (local_20 = asl::String::operator[](&this->_out,i); *local_20 != '\0';
        local_20 = local_20 + 1) {
      if (*local_20 == ',') {
        *local_20 = '.';
        return;
      }
    }
  }
  else if (NAN(x)) {
    asl::String::operator<<(&this->_out,"null");
  }
  else {
    pcVar3 = "1e400";
    if (x < 0.0) {
      pcVar3 = "-1e400";
    }
    asl::String::operator<<(&this->_out,pcVar3);
  }
  return;
}

Assistant:

void XdlEncoder::new_number(float x)
{
	int n = _out.length();
#if defined(_MSC_VER) && _MSC_VER < 1800
	if (!_finite(x))
#else
	if (!isfinite(x))
#endif
	{
		if (x != x)
			_out << "null";
		else
			_out << ((x < 0) ? "-1e400" : "1e400");
		return;
	}
	_out.resize(n + 16);
	_out.fix(n + snprintf(&_out[n], 17, _fmtF, x));

	// Fix decimal comma of some locales
#ifndef ASL_NO_FIX_DOT
	char* p = &_out[n];
	while (*p)
	{
		if (*p == ',') {
			*p = '.';
			break;
		}
		p++;
	}
#endif
}